

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O1

RABlockVisitItem __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlockVisitItem>::pop
          (ZoneStack<asmjit::v1_14::RABlockVisitItem> *this)

{
  int *piVar1;
  uint *puVar2;
  ZoneAllocator *pZVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  Error EVar6;
  uint uVar7;
  RABlock *extraout_RAX;
  RABlock *extraout_RAX_00;
  undefined4 extraout_var;
  RABlock *pRVar8;
  uint uVar9;
  ZoneAllocator *in_RCX;
  uint *puVar10;
  long *plVar11;
  uint *puVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  ZoneAllocator *extraout_RDX_01;
  ZoneAllocator *pZVar16;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 uVar17;
  undefined8 extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined4 extraout_EDX;
  long extraout_RDX_09;
  long extraout_RDX_10;
  long lVar18;
  long lVar19;
  ulong extraout_RDX_11;
  ulong uVar20;
  int iVar21;
  ZoneVectorBase *unaff_RBX;
  uint uVar22;
  ulong unaff_RBP;
  ulong uVar23;
  ZoneAllocator *in_RSI;
  uint *puVar24;
  long *plVar25;
  ZoneAllocator *allocator;
  ulong uVar26;
  uint *puVar27;
  ZoneAllocator *pZVar28;
  undefined2 uVar29;
  ZoneAllocator *in_R8;
  uint *puVar30;
  long *plVar31;
  ZoneAllocator *pZVar32;
  int iVar33;
  long *plVar34;
  long lVar35;
  uint *in_R11;
  long *plVar36;
  long *plVar37;
  ZoneVectorBase *this_00;
  bool bVar38;
  bool bVar39;
  RABlockVisitItem RVar40;
  RABlockVisitItem RVar41;
  RABlockVisitItem RVar42;
  RABlockVisitItem RVar43;
  RABlockVisitItem RVar44;
  RABlockVisitItem RVar45;
  RABlockVisitItem RVar46;
  RABlockVisitItem RVar47;
  RABlockVisitItem RVar48;
  RABlockVisitItem RVar49;
  ulong auStack_4f0 [2];
  ZoneVectorBase ZStack_4e0;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 uStack_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  uint *puStack_d8;
  ulong uStack_d0;
  size_t sStack_a0;
  ZoneVectorBase *pZStack_98;
  ZoneAllocator *pZStack_88;
  ZoneAllocator *pZStack_80;
  code *pcStack_78;
  uint *puStack_70;
  code *pcStack_68;
  ZoneVectorBase *pZStack_60;
  
  if (*(long *)this == 0) {
    pop();
LAB_0012aae1:
    pop();
LAB_0012aae6:
    pop();
LAB_0012aaeb:
    pop();
  }
  else {
    lVar18 = *(long *)&this->field_0x10;
    in_RCX = *(ZoneAllocator **)(lVar18 + 0x18);
    if (*(ZoneAllocator **)(*(long *)&this->field_0x8 + 0x10) == in_RCX) goto LAB_0012aae1;
    in_RSI = *(ZoneAllocator **)(lVar18 + 0x10);
    if (in_RSI == in_RCX) goto LAB_0012aae6;
    pZVar16 = in_RCX + -0x10;
    in_R8 = (ZoneAllocator *)(lVar18 + 0x20);
    if (pZVar16 < in_R8) goto LAB_0012aaeb;
    if (in_RSI <= pZVar16) {
      auVar4 = *(undefined1 (*) [12])(in_RCX + -0x10);
      *(ZoneAllocator **)(lVar18 + 0x18) = pZVar16;
      if (pZVar16 == in_RSI) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,1,0x110);
      }
      RVar40._12_4_ = 0;
      RVar40._0_12_ = auVar4;
      return RVar40;
    }
  }
  pop();
  pRVar8 = *(RABlock **)&((ZoneVectorBase *)this)->_data;
  uVar17 = extraout_RDX;
  if (pRVar8 == (RABlock *)0x0) {
LAB_0012ab7b:
    RVar41._8_8_ = uVar17;
    RVar41._block = pRVar8;
    return RVar41;
  }
  if (*(long *)in_RSI == 0) {
    ZoneBitVector::release();
  }
  else {
    uVar15 = ((ZoneVectorBase *)this)->_capacity;
    in_RCX = (ZoneAllocator *)(ulong)uVar15;
    unaff_RBX = (ZoneVectorBase *)this;
    if (7 < uVar15) {
      uVar20 = (ulong)(uVar15 >> 3);
      if (uVar15 < 0x1008) {
        if (uVar15 < 0x408) {
          uVar26 = uVar20 + 0x1fffffffff >> 5;
        }
        else {
          uVar26 = (uVar20 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar26 = 0;
      }
      if (uVar15 < 0x1008) {
        uVar17 = *(undefined8 *)(in_RSI + (uVar26 & 0xffffffff) * 8 + 8);
        *(undefined8 *)pRVar8 = uVar17;
        *(RABlock **)(in_RSI + (uVar26 & 0xffffffff) * 8 + 8) = pRVar8;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar8,uVar20);
        pRVar8 = extraout_RAX;
        uVar17 = extraout_RDX_00;
      }
      *(undefined8 *)&((ZoneVectorBase *)this)->_data = 0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      goto LAB_0012ab7b;
    }
  }
  ZoneBitVector::release();
  if (((ZoneVectorBase *)this)->_data == (void *)0x0) {
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
LAB_0012abd0:
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  }
  else {
    lVar18 = *(long *)&((ZoneVectorBase *)this)->_size;
    in_RCX = *(ZoneAllocator **)(lVar18 + 0x10);
    if (in_RCX == *(ZoneAllocator **)((long)((ZoneVectorBase *)((long)this + 0x10))->_data + 0x18))
    goto LAB_0012abd0;
    pZVar16 = *(ZoneAllocator **)(lVar18 + 0x18);
    if (in_RCX != pZVar16) {
      pRVar8 = *(RABlock **)in_RCX;
      *(ZoneAllocator **)(lVar18 + 0x10) = in_RCX + 8;
      if (in_RCX + 8 == pZVar16) {
        ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
        pZVar16 = extraout_RDX_01;
      }
      RVar42._8_8_ = pZVar16;
      RVar42._block = pRVar8;
      return RVar42;
    }
  }
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  pRVar8 = *(RABlock **)&((ZoneVectorBase *)this)->_data;
  uVar17 = extraout_RDX_02;
  if (pRVar8 == (RABlock *)0x0) {
LAB_0012ac5d:
    RVar43._8_8_ = uVar17;
    RVar43._block = pRVar8;
    return RVar43;
  }
  if (*(long *)in_RSI == 0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar15 = ((ZoneVectorBase *)this)->_capacity << 2;
    uVar20 = (ulong)uVar15;
    unaff_RBX = (ZoneVectorBase *)this;
    if (uVar20 != 0) {
      if (uVar15 < 0x201) {
        if (uVar15 < 0x81) {
          uVar9 = (uint)(uVar20 + 0x1fffffffff >> 5);
        }
        else {
          uVar9 = (int)(uVar20 + 0x3fffffff7f >> 6) + 4;
        }
      }
      else {
        uVar9 = 0;
      }
      if (uVar15 < 0x201) {
        uVar17 = *(undefined8 *)(in_RSI + (ulong)uVar9 * 8 + 8);
        *(undefined8 *)pRVar8 = uVar17;
        *(RABlock **)(in_RSI + (ulong)uVar9 * 8 + 8) = pRVar8;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar8,uVar20);
        pRVar8 = extraout_RAX_00;
        uVar17 = extraout_RDX_03;
      }
      *(undefined8 *)&((ZoneVectorBase *)this)->_data = 0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      goto LAB_0012ac5d;
    }
  }
  ZoneVector<unsigned_int>::release();
  if (in_RSI < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    RVar44._8_8_ = extraout_RDX_04;
    RVar44._block = (RABlock *)((long)in_RSI * 8 + *(long *)&((ZoneVectorBase *)this)->_data);
    return RVar44;
  }
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  pRVar8 = (RABlock *)0x0;
  puVar12 = extraout_RDX_05;
  pZStack_60 = unaff_RBX;
  if (((ZoneVectorBase *)this)->_capacity < *(int *)(in_RCX + 8) + extraout_RDX_05[2]) {
    pcStack_68 = (code *)0x12ade5;
    EVar6 = ZoneVectorBase::_growingReserve
                      ((ZoneVectorBase *)this,in_RSI,0xc,*(int *)(in_RCX + 8) + extraout_RDX_05[2]);
    pRVar8 = (RABlock *)CONCAT44(extraout_var,EVar6);
    puVar12 = extraout_RDX_06;
  }
  if ((int)pRVar8 != 0) {
LAB_0012adcf:
    RVar45._8_8_ = puVar12;
    RVar45._block = pRVar8;
    return RVar45;
  }
  puVar10 = (uint *)((ZoneVectorBase *)this)->_data;
  puVar30 = *(uint **)extraout_RDX_05;
  puVar12 = *(uint **)in_RCX;
  puVar2 = puVar30 + (ulong)extraout_RDX_05[2] * 3;
  puVar24 = puVar12 + (ulong)*(uint *)(in_RCX + 8) * 3;
  puVar27 = puVar10;
  if ((ulong)*(uint *)(in_RCX + 8) != 0 && (ulong)extraout_RDX_05[2] != 0) {
    uVar15 = *puVar30;
    do {
      while( true ) {
        uVar9 = puVar12[1];
        in_R11 = (uint *)(ulong)uVar9;
        if (uVar15 < uVar9) break;
        unaff_RBP = (ulong)*puVar12;
        *puVar27 = *puVar12;
        puVar27[1] = uVar9;
        in_R11 = (uint *)(ulong)*(uint *)in_R8;
        puVar27[2] = *(uint *)in_R8;
        puVar27 = puVar27 + 3;
        puVar12 = puVar12 + 3;
        if (puVar12 == puVar24) {
          bVar38 = true;
          goto LAB_0012ad68;
        }
      }
      uVar15 = *puVar12;
      while( true ) {
        uVar9 = puVar30[1];
        unaff_RBP = (ulong)uVar9;
        if (uVar15 < uVar9) break;
        in_R11 = puVar27 + 3;
        in_RCX = (ZoneAllocator *)(ulong)*puVar30;
        *puVar27 = *puVar30;
        puVar27[1] = uVar9;
        unaff_RBP = (ulong)puVar30[2];
        puVar27[2] = puVar30[2];
        puVar30 = puVar30 + 3;
        puVar27 = in_R11;
        if (puVar30 == puVar2) {
          bVar38 = true;
          goto LAB_0012ad68;
        }
      }
      uVar15 = *puVar30;
    } while (puVar12[1] <= uVar15);
    pRVar8 = (RABlock *)0xffffffff;
    bVar38 = false;
LAB_0012ad68:
    if (!bVar38) goto LAB_0012adcf;
  }
  for (; puVar30 != puVar2; puVar30 = puVar30 + 3) {
    *(undefined8 *)puVar27 = *(undefined8 *)puVar30;
    puVar27[2] = puVar30[2];
    puVar27 = puVar27 + 3;
  }
  for (; puVar12 != puVar24; puVar12 = puVar12 + 3) {
    *(undefined8 *)puVar27 = *(undefined8 *)puVar12;
    puVar27[2] = *(uint *)in_R8;
    puVar27 = puVar27 + 3;
  }
  if (puVar27 < puVar10) {
LAB_0012adea:
    pcStack_68 = (code *)0x12adef;
    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
    uVar15 = (uint)puVar10;
  }
  else {
    puVar12 = puVar10 + (ulong)((ZoneVectorBase *)this)->_capacity * 3;
    if (puVar12 < puVar27) goto LAB_0012adea;
    puVar27 = (uint *)((ulong)((long)puVar27 - (long)puVar10) >> 2);
    uVar15 = (int)puVar27 * -0x55555555;
    if (uVar15 <= ((ZoneVectorBase *)this)->_capacity) {
      ((ZoneVectorBase *)this)->_size = uVar15;
      pRVar8 = (RABlock *)0x0;
      goto LAB_0012adcf;
    }
  }
  uVar29 = SUB82(puVar30,0);
  pcStack_68 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
  RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
  pcStack_68 = (code *)(ulong)puVar27[2];
  if (puVar24 < pcStack_68) {
    RVar46._8_8_ = extraout_RDX_07;
    RVar46._block = (RABlock *)((long)puVar24 * 8 + *(long *)puVar27);
    return RVar46;
  }
  puStack_70 = (uint *)0x12ae0d;
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  puStack_70 = (uint *)(ulong)puVar27[2];
  if (puVar24 < puStack_70) {
    RVar47._block = (RABlock *)((long)puVar24 * 0xc + *(long *)puVar27);
    RVar47._8_8_ = extraout_RDX_08;
    return RVar47;
  }
  pcStack_78 = RAStackAllocator::newSlot;
  ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
  pZStack_98 = (ZoneVectorBase *)this;
  pZStack_88 = in_R8;
  pZStack_80 = in_RCX;
  pcStack_78 = (code *)unaff_RBP;
  if ((puVar27[9] != puVar27[8]) ||
     (EVar6 = ZoneVectorBase::_grow((ZoneVectorBase *)(puVar27 + 6),*(ZoneAllocator **)puVar27,8,1),
     lVar18 = extraout_RDX_09, EVar6 == 0)) {
    pZVar16 = *(ZoneAllocator **)puVar27;
    if (*(long *)pZVar16 == 0) {
      RAStackAllocator::newSlot();
LAB_0012aedb:
      RAStackAllocator::newSlot();
      uStack_d0 = (ulong)puVar24 & 0xffffffff;
      puStack_d8 = puVar27;
      plVar11 = *(long **)(pZVar16 + 0x18);
      uVar20 = (ulong)*(uint *)(pZVar16 + 0x20);
      if (uVar20 != 0) {
        plVar25 = (long *)0x0;
        do {
          lVar18 = *(long *)((long)plVar11 + (long)plVar25);
          bVar14 = *(byte *)(lVar18 + 1);
          if (bVar14 == 0) goto LAB_0012b353;
          uVar15 = 0;
          if (bVar14 != 0) {
            for (; (bVar14 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
            }
          }
          uVar9 = 6;
          if ((char)uVar15 != '\a') {
            uVar9 = uVar15;
          }
          if ((*(byte *)(lVar18 + 2) & 1) == 0) {
            uVar26 = (ulong)(uVar9 & 0xff);
          }
          else {
            uVar26 = (ulong)(byte)((byte)uVar9 ^ 7) * (ulong)*(uint *)(lVar18 + 8) + 0x10;
          }
          if (0xfffffffe < uVar26) {
            uVar26 = 0xffffffff;
          }
          *(int *)(lVar18 + 0xc) = (int)uVar26;
          plVar25 = plVar25 + 1;
        } while (uVar20 * 8 - (long)plVar25 != 0);
      }
      plVar25 = plVar11 + uVar20;
      lVar18 = 0;
LAB_0012af74:
      uVar26 = (long)plVar25 - (long)plVar11 >> 3;
      if (7 < uVar26) {
        plVar37 = plVar11 + 1;
        plVar31 = plVar25 + -1;
        lVar19 = *(long *)((long)plVar11 + (uVar26 & 0xfffffffffffffffe) * 4);
        *(long *)((long)plVar11 + (uVar26 & 0xfffffffffffffffe) * 4) = *plVar11;
        *plVar11 = lVar19;
        lVar19 = plVar11[1];
        if (*(uint *)(plVar25[-1] + 0xc) < *(uint *)(lVar19 + 0xc)) {
          *plVar37 = plVar25[-1];
          *plVar31 = lVar19;
        }
        lVar19 = *plVar11;
        if (*(uint *)(*plVar31 + 0xc) < *(uint *)(lVar19 + 0xc)) {
          *plVar11 = *plVar31;
          *plVar31 = lVar19;
        }
        lVar19 = plVar11[1];
        if (*(uint *)(*plVar11 + 0xc) < *(uint *)(lVar19 + 0xc)) {
          plVar11[1] = *plVar11;
          *plVar11 = lVar19;
        }
LAB_0012aff6:
        if (plVar37 < plVar31) goto code_r0x0012affb;
        goto LAB_0012b010;
      }
      if ((plVar11 != plVar25) && (1 < (long)uVar26)) {
        plVar37 = plVar11 + 1;
        plVar31 = plVar37;
joined_r0x0012b098:
        do {
          if (plVar11 < plVar37) {
            lVar19 = plVar37[-1];
            uVar15 = *(uint *)(lVar19 + 0xc);
            in_R11 = (uint *)(ulong)uVar15;
            if (*(uint *)(*plVar37 + 0xc) < uVar15) {
              plVar37[-1] = *plVar37;
              *plVar37 = lVar19;
              plVar37 = plVar37 + -1;
              goto joined_r0x0012b098;
            }
          }
          plVar37 = plVar31 + 1;
          plVar31 = plVar37;
        } while (plVar37 < (long *)(((long)plVar25 - (long)plVar11) + (long)plVar11));
      }
      if (lVar18 != 0) {
        plVar11 = *(long **)((long)auStack_4f0 + lVar18);
        plVar25 = *(long **)((long)auStack_4f0 + lVar18 + 8);
        lVar18 = lVar18 + -0x10;
        goto LAB_0012af74;
      }
      uStack_490 = 0;
      uStack_488 = 0;
      uStack_4a0 = 0;
      uStack_498 = 0;
      uStack_4b0 = 0;
      uStack_4a8 = 0;
      uStack_4c0 = 0;
      uStack_4b8 = 0;
      uStack_4d0 = 0;
      uStack_4c8 = 0;
      ZStack_4e0._data = (void *)0x0;
      ZStack_4e0._size = 0;
      ZStack_4e0._capacity = 0;
      bVar38 = uVar20 == 0;
      uVar26 = 0;
      if (bVar38) {
        iVar33 = -1;
      }
      else {
        pZVar32 = *(ZoneAllocator **)(pZVar16 + 0x18);
        pZVar3 = pZVar32 + uVar20 * 8;
        uVar20 = 0;
        do {
          lVar18 = *(long *)pZVar32;
          iVar33 = 7;
          if ((*(byte *)(lVar18 + 2) & 2) == 0) {
            bVar14 = *(byte *)(lVar18 + 1);
            uVar15 = *(uint *)(lVar18 + 4);
            allocator = (ZoneAllocator *)(ulong)uVar15;
            iVar33 = 0;
            if (uVar15 < 0x40) {
              uVar9 = 0;
              if (uVar15 != 0) {
                for (; (uVar15 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
                }
              }
              puVar12 = (uint *)((long)&ZStack_4e0._size + (ulong)(uVar9 << 4));
              lVar19 = 0;
              if ((ulong)uVar9 < 6) {
                lVar19 = 5 - (ulong)uVar9;
              }
              lVar19 = lVar19 + 1;
              do {
                bVar39 = *puVar12 != 0;
                if (bVar39) {
                  uVar9 = *puVar12 - 1;
                  pZVar28 = (ZoneAllocator *)(ulong)uVar9;
                  *puVar12 = uVar9;
                  uVar9 = *(uint *)(*(long *)(puVar12 + -2) + (long)pZVar28 * 8);
                  if (uVar9 % (uint)bVar14 != 0) goto LAB_0012b35d;
                  iVar33 = *(int *)(*(long *)(puVar12 + -2) + 4 + (long)pZVar28 * 8);
                  *(uint *)(lVar18 + 0x10) = uVar9;
                  iVar33 = iVar33 - uVar15;
                  uVar13 = (ulong)(uVar9 - uVar15);
                  goto LAB_0012b1c7;
                }
                puVar12 = puVar12 + 4;
                lVar19 = lVar19 + -1;
              } while (lVar19 != 0);
              uVar13 = 0;
            }
            else {
              bVar39 = false;
              uVar13 = 0;
            }
LAB_0012b1c7:
            uVar9 = ((int)uVar20 + (uint)bVar14) - 1;
            auStack_4f0[1] = (ulong)bVar14;
            uVar22 = -(uint)bVar14 & uVar9;
            iVar21 = uVar22 - (int)uVar20;
            bVar14 = iVar21 == 0 | bVar39;
            uVar26 = (ulong)CONCAT31((int3)(uVar9 >> 8),bVar14);
            if (bVar14 != 0) {
              iVar21 = iVar33;
            }
            uVar20 = uVar20 & 0xffffffff;
            if (bVar39 == false) {
              uVar20 = (ulong)uVar22;
            }
            if (iVar21 != 0) {
              uVar23 = (ulong)uVar22;
              if (bVar14 != 0) {
                uVar23 = uVar13;
              }
              uVar9 = iVar21 + (int)uVar23;
              do {
                uVar15 = (uint)allocator;
                uVar22 = (uint)uVar23;
                iVar33 = 0;
                if (uVar9 <= uVar22) goto LAB_0012b2cf;
                iVar33 = 0;
                if (uVar22 != 0) {
                  for (; (uVar22 >> iVar33 & 1) == 0; iVar33 = iVar33 + 1) {
                  }
                }
                uVar15 = 1 << ((byte)iVar33 & 0x1f);
                uVar26 = 0xd;
                if (uVar15 <= uVar9 - uVar22) {
                  uVar26 = (ulong)(uint)(iVar33 << 4);
                  this_00 = (ZoneVectorBase *)((long)&ZStack_4e0._data + uVar26);
                  if (*(int *)((long)&ZStack_4e0._size + uVar26) ==
                      *(int *)((long)&ZStack_4e0._capacity + uVar26)) {
                    allocator = *(ZoneAllocator **)pZVar16;
                    auStack_4f0[0] = uVar20;
                    uVar7 = ZoneVectorBase::_grow(this_00,allocator,8,1);
                    in_R11 = (uint *)((ulong)in_R11 & 0xffffffff);
                    uVar20 = auStack_4f0[0];
                    if (uVar7 == 0) goto LAB_0012b235;
                  }
                  else {
LAB_0012b235:
                    allocator = (ZoneAllocator *)(uVar23 | (ulong)uVar15 << 0x20);
                    *(ZoneAllocator **)
                     ((long)this_00->_data + (ulong)*(uint *)((long)&ZStack_4e0._size + uVar26) * 8)
                         = allocator;
                    piVar1 = (int *)((long)&ZStack_4e0._size + uVar26);
                    *piVar1 = *piVar1 + 1;
                    uVar7 = 0;
                  }
                  uVar26 = (ulong)(uVar7 != 0);
                  in_R11 = (uint *)((ulong)in_R11 & 0xffffffff);
                  if (uVar7 != 0) {
                    in_R11 = (uint *)(ulong)uVar7;
                    uVar15 = 0;
                  }
                  uVar23 = (ulong)(uVar15 + uVar22);
                }
                uVar15 = (uint)allocator;
                iVar21 = (int)uVar26;
              } while (iVar21 == 0);
              iVar33 = 0;
              if (iVar21 != 0xd) {
                iVar33 = iVar21;
              }
LAB_0012b2cf:
              if (iVar33 != 0) goto LAB_0012b2f6;
            }
            iVar33 = 0;
            if (bVar39 == false) {
              uVar26 = (uVar20 & 0xffffffff) % (auStack_4f0[1] & 0xffffffff);
              pZVar28 = pZVar3;
              if ((int)uVar26 != 0) goto LAB_0012b358;
              *(int *)(lVar18 + 0x10) = (int)uVar20;
              uVar20 = (ulong)(uint)((int)uVar20 + *(int *)(lVar18 + 4));
            }
          }
LAB_0012b2f6:
          if ((iVar33 != 7) && (iVar33 != 0)) break;
          pZVar32 = pZVar32 + 8;
          bVar38 = pZVar32 == pZVar3;
        } while (!bVar38);
        iVar33 = (int)uVar20 + -1;
      }
      if (bVar38) {
        *(int *)(pZVar16 + 0xc) = -*(int *)(pZVar16 + 0x10) & iVar33 + *(int *)(pZVar16 + 0x10);
        in_R11 = (uint *)0x0;
      }
      RVar49._block = (RABlock *)((ulong)in_R11 & 0xffffffff);
      RVar49._8_8_ = uVar26;
      return RVar49;
    }
    pRVar8 = (RABlock *)ZoneAllocator::_alloc(pZVar16,0x14,&sStack_a0);
    lVar18 = extraout_RDX_10;
    if (pRVar8 != (RABlock *)0x0) {
      *pRVar8 = SUB81((ulong)puVar24 & 0xffffffff,0);
      pRVar8[1] = (RABlock)((char)uVar15 + (uVar15 == 0));
      *(undefined2 *)(pRVar8 + 2) = uVar29;
      *(undefined4 *)(pRVar8 + 8) = 0;
      *(undefined4 *)(pRVar8 + 4) = extraout_EDX;
      *(undefined8 *)(pRVar8 + 0xc) = 0;
      if (uVar15 < puVar27[4]) {
        uVar15 = puVar27[4];
      }
      puVar27[4] = uVar15;
      if (puVar27[9] <= puVar27[8]) goto LAB_0012aedb;
      lVar18 = *(long *)(puVar27 + 6);
      *(RABlock **)(lVar18 + (ulong)puVar27[8] * 8) = pRVar8;
      puVar27[8] = puVar27[8] + 1;
      goto LAB_0012aec5;
    }
  }
  pRVar8 = (RABlock *)0x0;
LAB_0012aec5:
  RVar48._8_8_ = lVar18;
  RVar48._block = pRVar8;
  return RVar48;
code_r0x0012affb:
  plVar36 = plVar37 + 1;
  plVar37 = plVar37 + 1;
  if (*(uint *)(*plVar36 + 0xc) < *(uint *)(*plVar11 + 0xc)) goto LAB_0012aff6;
LAB_0012b010:
  do {
    if (plVar31 <= plVar11) break;
    plVar36 = plVar31 + -1;
    plVar31 = plVar31 + -1;
  } while (*(uint *)(*plVar11 + 0xc) < *(uint *)(*plVar36 + 0xc));
  if (plVar37 <= plVar31) {
    lVar19 = *plVar37;
    *plVar37 = *plVar31;
    *plVar31 = lVar19;
    goto LAB_0012aff6;
  }
  lVar19 = *plVar11;
  lVar35 = (long)plVar31 - (long)plVar11;
  in_R11 = (uint *)((long)plVar25 - (long)plVar37);
  plVar36 = plVar37;
  if ((long)in_R11 < lVar35) {
    plVar36 = plVar11;
  }
  *plVar11 = *plVar31;
  plVar34 = plVar25;
  if ((long)in_R11 < lVar35) {
    plVar34 = plVar31;
  }
  *plVar31 = lVar19;
  *(long **)((long)&ZStack_4e0._data + lVar18) = plVar36;
  *(long **)((long)&ZStack_4e0._size + lVar18) = plVar34;
  if (lVar18 < 0x3f1) {
    if ((long)in_R11 < lVar35) {
      plVar11 = plVar37;
      plVar31 = plVar25;
    }
    plVar25 = plVar31;
    lVar18 = lVar18 + 0x10;
    goto LAB_0012af74;
  }
  RAStackAllocator::calculateStackFrame();
LAB_0012b353:
  uVar15 = (uint)plVar25;
  RAStackAllocator::calculateStackFrame();
  pZVar28 = pZVar16;
LAB_0012b358:
  RAStackAllocator::calculateStackFrame();
LAB_0012b35d:
  RAStackAllocator::calculateStackFrame();
  uVar9 = *(uint *)(pZVar28 + 0x20);
  uVar20 = extraout_RDX_11;
  if ((ulong)uVar9 != 0) {
    lVar18 = *(long *)(pZVar28 + 0x18);
    uVar20 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar18 + uVar20) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar18 + uVar20) + 0x10);
        *piVar1 = *piVar1 + uVar15;
      }
      uVar20 = uVar20 + 8;
    } while ((ulong)uVar9 << 3 != uVar20);
  }
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar20;
  return (RABlockVisitItem)(auVar5 << 0x40);
}

Assistant:

inline T pop() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexLast];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->end<T>();
    T item = *--ptr;
    ASMJIT_ASSERT(ptr >= block->data<T>());
    ASMJIT_ASSERT(ptr >= block->start<T>());

    block->setEnd(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexLast, kMidBlockIndex);

    return item;
  }